

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdapistd.c
# Opt level: O2

void jpeg_crop_scanline(j_decompress_ptr cinfo,JDIMENSION *xoffset,JDIMENSION *width)

{
  int iVar1;
  uint uVar2;
  jpeg_error_mgr *pjVar3;
  long lVar4;
  long lVar5;
  uint uVar6;
  jpeg_decomp_master *pjVar7;
  uint uVar8;
  uint uVar9;
  long b;
  JDIMENSION JVar10;
  JDIMENSION *pJVar11;
  
  iVar1 = cinfo->global_state;
  if ((iVar1 != 0xcd) || (cinfo->output_scanline != 0)) {
    pjVar3 = cinfo->err;
    pjVar3->msg_code = 0x14;
    (pjVar3->msg_parm).i[0] = iVar1;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  if (xoffset == (JDIMENSION *)0x0 || width == (JDIMENSION *)0x0) {
    pjVar3 = cinfo->err;
    pjVar3->msg_code = 0x7c;
    (*pjVar3->error_exit)((j_common_ptr)cinfo);
  }
  uVar9 = *width;
  if (uVar9 != 0) {
    uVar8 = cinfo->output_width;
    if (*xoffset + uVar9 <= uVar8) goto LAB_0011ba2a;
  }
  pjVar3 = cinfo->err;
  pjVar3->msg_code = 0x46;
  (*pjVar3->error_exit)((j_common_ptr)cinfo);
  uVar9 = *width;
  uVar8 = cinfo->output_width;
LAB_0011ba2a:
  if (uVar9 != uVar8) {
    if ((cinfo->comps_in_scan == 1) && (cinfo->num_components == 1)) {
      uVar9 = cinfo->min_DCT_scaled_size;
    }
    else {
      uVar9 = cinfo->max_h_samp_factor * cinfo->min_DCT_scaled_size;
    }
    uVar8 = *xoffset % uVar9;
    *xoffset = *xoffset - uVar8;
    JVar10 = uVar8 + *width;
    *width = JVar10;
    cinfo->output_width = JVar10;
    b = (long)(int)uVar9;
    cinfo->master->first_iMCU_col = SUB164(ZEXT416(*xoffset) / SEXT816(b),0);
    lVar4 = jdiv_round_up((ulong)(JVar10 + *xoffset),b);
    pjVar7 = cinfo->master;
    pjVar7->last_iMCU_col = (int)lVar4 - 1;
    pJVar11 = &cinfo->comp_info->downsampled_width;
    uVar9 = 0;
    for (lVar4 = 0; lVar4 < cinfo->num_components; lVar4 = lVar4 + 1) {
      uVar8 = pJVar11[-8];
      if (cinfo->num_components == 1 && cinfo->comps_in_scan == 1) {
        uVar8 = 1;
      }
      uVar2 = *pJVar11;
      lVar5 = jdiv_round_up((ulong)(pJVar11[-8] * cinfo->output_width),
                            (long)cinfo->max_h_samp_factor);
      uVar6 = uVar9;
      if (1 < (int)uVar2) {
        uVar6 = 1;
      }
      *pJVar11 = (uint)lVar5;
      if ((uint)lVar5 < 2) {
        uVar9 = uVar6;
      }
      cinfo->master->first_MCU_col[lVar4] = SUB164(ZEXT416(*xoffset * uVar8) / SEXT816(b),0);
      lVar5 = jdiv_round_up((ulong)((cinfo->output_width + *xoffset) * uVar8),b);
      pjVar7 = cinfo->master;
      pjVar7->last_MCU_col[lVar4] = (int)lVar5 - 1;
      pJVar11 = pJVar11 + 0x18;
    }
    if (uVar9 != 0) {
      pjVar7->jinit_upsampler_no_alloc = 1;
      jinit_upsampler(cinfo);
      cinfo->master->jinit_upsampler_no_alloc = 0;
    }
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_crop_scanline(j_decompress_ptr cinfo, JDIMENSION *xoffset,
                   JDIMENSION *width)
{
  int ci, align, orig_downsampled_width;
  JDIMENSION input_xoffset;
  boolean reinit_upsampler = FALSE;
  jpeg_component_info *compptr;

  if (cinfo->global_state != DSTATE_SCANNING || cinfo->output_scanline != 0)
    ERREXIT1(cinfo, JERR_BAD_STATE, cinfo->global_state);

  if (!xoffset || !width)
    ERREXIT(cinfo, JERR_BAD_CROP_SPEC);

  /* xoffset and width must fall within the output image dimensions. */
  if (*width == 0 || *xoffset + *width > cinfo->output_width)
    ERREXIT(cinfo, JERR_WIDTH_OVERFLOW);

  /* No need to do anything if the caller wants the entire width. */
  if (*width == cinfo->output_width)
    return;

  /* Ensuring the proper alignment of xoffset is tricky.  At minimum, it
   * must align with an MCU boundary, because:
   *
   *   (1) The IDCT is performed in blocks, and it is not feasible to modify
   *       the algorithm so that it can transform partial blocks.
   *   (2) Because of the SIMD extensions, any input buffer passed to the
   *       upsampling and color conversion routines must be aligned to the
   *       SIMD word size (for instance, 128-bit in the case of SSE2.)  The
   *       easiest way to accomplish this without copying data is to ensure
   *       that upsampling and color conversion begin at the start of the
   *       first MCU column that will be inverse transformed.
   *
   * In practice, we actually impose a stricter alignment requirement.  We
   * require that xoffset be a multiple of the maximum MCU column width of all
   * of the components (the "iMCU column width.")  This is to simplify the
   * single-pass decompression case, allowing us to use the same MCU column
   * width for all of the components.
   */
  if (cinfo->comps_in_scan == 1 && cinfo->num_components == 1)
    align = cinfo->_min_DCT_scaled_size;
  else
    align = cinfo->_min_DCT_scaled_size * cinfo->max_h_samp_factor;

  /* Adjust xoffset to the nearest iMCU boundary <= the requested value */
  input_xoffset = *xoffset;
  *xoffset = (input_xoffset / align) * align;

  /* Adjust the width so that the right edge of the output image is as
   * requested (only the left edge is altered.)  It is important that calling
   * programs check this value after this function returns, so that they can
   * allocate an output buffer with the appropriate size.
   */
  *width = *width + input_xoffset - *xoffset;
  cinfo->output_width = *width;

  /* Set the first and last iMCU columns that we must decompress.  These values
   * will be used in single-scan decompressions.
   */
  cinfo->master->first_iMCU_col = (JDIMENSION)(long)(*xoffset) / (long)align;
  cinfo->master->last_iMCU_col =
    (JDIMENSION)jdiv_round_up((long)(*xoffset + cinfo->output_width),
                              (long)align) - 1;

  for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
       ci++, compptr++) {
    int hsf = (cinfo->comps_in_scan == 1 && cinfo->num_components == 1) ?
              1 : compptr->h_samp_factor;

    /* Set downsampled_width to the new output width. */
    orig_downsampled_width = compptr->downsampled_width;
    compptr->downsampled_width =
      (JDIMENSION)jdiv_round_up((long)(cinfo->output_width *
                                       compptr->h_samp_factor),
                                (long)cinfo->max_h_samp_factor);
    if (compptr->downsampled_width < 2 && orig_downsampled_width >= 2)
      reinit_upsampler = TRUE;

    /* Set the first and last iMCU columns that we must decompress.  These
     * values will be used in multi-scan decompressions.
     */
    cinfo->master->first_MCU_col[ci] =
      (JDIMENSION)(long)(*xoffset * hsf) / (long)align;
    cinfo->master->last_MCU_col[ci] =
      (JDIMENSION)jdiv_round_up((long)((*xoffset + cinfo->output_width) * hsf),
                                (long)align) - 1;
  }

  if (reinit_upsampler) {
    cinfo->master->jinit_upsampler_no_alloc = TRUE;
    jinit_upsampler(cinfo);
    cinfo->master->jinit_upsampler_no_alloc = FALSE;
  }
}